

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<PropertyDef>::emplace<PropertyDef_const&>
          (QMovableArrayOps<PropertyDef> *this,qsizetype i,PropertyDef *args)

{
  PropertyDef **ppPVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  PropertyDef *pPVar5;
  PropertyDef *pPVar6;
  long in_FS_OFFSET;
  bool bVar7;
  PropertyDef tmp;
  PropertyDef local_190;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0012b83c:
    memset(&local_190,0xaa,0x158);
    PropertyDef::PropertyDef(&local_190,args);
    bVar7 = (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size !=
            0;
    QArrayDataPointer<PropertyDef>::detachAndGrow
              ((QArrayDataPointer<PropertyDef> *)this,(uint)(i == 0 && bVar7),1,(PropertyDef **)0x0,
               (QArrayDataPointer<PropertyDef> *)0x0);
    pPVar5 = (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.ptr;
    if (i == 0 && bVar7) {
      pPVar5[-1].name.d.d = local_190.name.d.d;
      pPVar5[-1].name.d.ptr = local_190.name.d.ptr;
      pPVar5[-1].name.d.size = local_190.name.d.size;
      pPVar5[-1].type.d.d = local_190.type.d.d;
      pPVar5[-1].type.d.ptr = local_190.type.d.ptr;
      pPVar5[-1].type.d.size = local_190.type.d.size;
      pPVar5[-1].member.d.d = local_190.member.d.d;
      pPVar5[-1].member.d.ptr = local_190.member.d.ptr;
      pPVar5[-1].member.d.size = local_190.member.d.size;
      pPVar5[-1].read.d.d = local_190.read.d.d;
      pPVar5[-1].read.d.ptr = local_190.read.d.ptr;
      pPVar5[-1].read.d.size = local_190.read.d.size;
      pPVar5[-1].write.d.d = local_190.write.d.d;
      pPVar5[-1].write.d.ptr = local_190.write.d.ptr;
      pPVar5[-1].write.d.size = local_190.write.d.size;
      pPVar5[-1].bind.d.d = local_190.bind.d.d;
      pPVar5[-1].bind.d.ptr = local_190.bind.d.ptr;
      pPVar5[-1].bind.d.size = local_190.bind.d.size;
      pPVar5[-1].reset.d.d = local_190.reset.d.d;
      pPVar5[-1].reset.d.ptr = local_190.reset.d.ptr;
      pPVar5[-1].reset.d.size = local_190.reset.d.size;
      pPVar5[-1].designable.d.d = local_190.designable.d.d;
      pPVar5[-1].designable.d.ptr = local_190.designable.d.ptr;
      pPVar5[-1].designable.d.size = local_190.designable.d.size;
      pPVar5[-1].scriptable.d.d = local_190.scriptable.d.d;
      pPVar5[-1].scriptable.d.ptr = local_190.scriptable.d.ptr;
      pPVar5[-1].scriptable.d.size = local_190.scriptable.d.size;
      pPVar5[-1].stored.d.d = local_190.stored.d.d;
      pPVar5[-1].stored.d.ptr = local_190.stored.d.ptr;
      pPVar5[-1].stored.d.size = local_190.stored.d.size;
      pPVar5[-1].user.d.d = local_190.user.d.d;
      pPVar5[-1].user.d.ptr = local_190.user.d.ptr;
      pPVar5[-1].user.d.size = local_190.user.d.size;
      pPVar5[-1].notify.d.d = local_190.notify.d.d;
      pPVar5[-1].notify.d.ptr = local_190.notify.d.ptr;
      pPVar5[-1].notify.d.size = local_190.notify.d.size;
      pPVar5[-1].inPrivateClass.d.d = local_190.inPrivateClass.d.d;
      pPVar5[-1].inPrivateClass.d.ptr = local_190.inPrivateClass.d.ptr;
      pPVar5[-1].inPrivateClass.d.size = local_190.inPrivateClass.d.size;
      pPVar5[-1].notifyId = local_190.notifyId;
      pPVar5[-1].gspec = local_190.gspec;
      pPVar5[-1].revision = local_190.revision;
      pPVar5[-1].typeTag =
           (TypeTags)
           local_190.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      pPVar5[-1].constant = local_190.constant;
      pPVar5[-1].final = local_190.final;
      pPVar5[-1].required = local_190.required;
      pPVar5[-1].field_0x14b = local_190._331_1_;
      pPVar5[-1].relativeIndex = local_190.relativeIndex;
      pPVar5[-1].location = local_190.location;
      ppPVar1 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                 ptr;
      *ppPVar1 = *ppPVar1 + -1;
    }
    else {
      memmove(pPVar5 + i + 1,pPVar5 + i,
              ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size
              - i) * 0x158);
      pPVar5[i].name.d.d = local_190.name.d.d;
      pPVar5[i].name.d.ptr = local_190.name.d.ptr;
      pPVar5[i].name.d.size = local_190.name.d.size;
      pPVar5[i].type.d.d = local_190.type.d.d;
      pPVar5[i].type.d.ptr = local_190.type.d.ptr;
      pPVar5[i].type.d.size = local_190.type.d.size;
      pPVar5[i].member.d.d = local_190.member.d.d;
      pPVar5[i].member.d.ptr = local_190.member.d.ptr;
      pPVar5[i].member.d.size = local_190.member.d.size;
      pPVar5[i].read.d.d = local_190.read.d.d;
      pPVar5[i].read.d.ptr = local_190.read.d.ptr;
      pPVar5[i].read.d.size = local_190.read.d.size;
      pPVar5[i].write.d.d = local_190.write.d.d;
      pPVar5[i].write.d.ptr = local_190.write.d.ptr;
      pPVar5[i].write.d.size = local_190.write.d.size;
      pPVar5[i].bind.d.d = local_190.bind.d.d;
      pPVar5[i].bind.d.ptr = local_190.bind.d.ptr;
      pPVar5[i].bind.d.size = local_190.bind.d.size;
      pPVar5[i].reset.d.d = local_190.reset.d.d;
      pPVar5[i].reset.d.ptr = local_190.reset.d.ptr;
      pPVar5[i].reset.d.size = local_190.reset.d.size;
      pPVar5[i].designable.d.d = local_190.designable.d.d;
      pPVar5[i].designable.d.ptr = local_190.designable.d.ptr;
      pPVar5[i].designable.d.size = local_190.designable.d.size;
      pPVar5[i].scriptable.d.d = local_190.scriptable.d.d;
      pPVar5[i].scriptable.d.ptr = local_190.scriptable.d.ptr;
      pPVar5[i].scriptable.d.size = local_190.scriptable.d.size;
      pPVar5[i].stored.d.d = local_190.stored.d.d;
      pPVar5[i].stored.d.ptr = local_190.stored.d.ptr;
      pPVar5[i].stored.d.size = local_190.stored.d.size;
      pPVar5[i].user.d.d = local_190.user.d.d;
      pPVar5[i].user.d.ptr = local_190.user.d.ptr;
      pPVar5[i].user.d.size = local_190.user.d.size;
      pPVar5[i].notify.d.d = local_190.notify.d.d;
      pPVar5[i].notify.d.ptr = local_190.notify.d.ptr;
      pPVar5[i].notify.d.size = local_190.notify.d.size;
      pPVar5[i].inPrivateClass.d.d = local_190.inPrivateClass.d.d;
      pPVar5[i].inPrivateClass.d.ptr = local_190.inPrivateClass.d.ptr;
      pPVar5[i].inPrivateClass.d.size = local_190.inPrivateClass.d.size;
      pPVar6 = pPVar5 + i;
      pPVar6->notifyId = local_190.notifyId;
      pPVar6->gspec = local_190.gspec;
      *(undefined8 *)(&pPVar6->notifyId + 2) = local_190._320_8_;
      pPVar5 = pPVar5 + i;
      pPVar5->constant = local_190.constant;
      pPVar5->final = local_190.final;
      pPVar5->required = local_190.required;
      pPVar5->field_0x14b = local_190._331_1_;
      pPVar5->relativeIndex = local_190.relativeIndex;
      *(qsizetype *)(&pPVar5->constant + 8) = local_190.location;
    }
    local_190.inPrivateClass.d.size = 0;
    local_190.inPrivateClass.d.ptr = (char *)0x0;
    local_190.inPrivateClass.d.d = (Data *)0x0;
    local_190.notify.d.size = 0;
    local_190.notify.d.ptr = (char *)0x0;
    local_190.notify.d.d = (Data *)0x0;
    local_190.user.d.size = 0;
    local_190.user.d.ptr = (char *)0x0;
    local_190.user.d.d = (Data *)0x0;
    local_190.stored.d.size = 0;
    local_190.stored.d.ptr = (char *)0x0;
    local_190.stored.d.d = (Data *)0x0;
    local_190.scriptable.d.size = 0;
    local_190.scriptable.d.ptr = (char *)0x0;
    local_190.scriptable.d.d = (Data *)0x0;
    local_190.designable.d.size = 0;
    local_190.designable.d.ptr = (char *)0x0;
    local_190.designable.d.d = (Data *)0x0;
    local_190.reset.d.size = 0;
    local_190.reset.d.ptr = (char *)0x0;
    local_190.reset.d.d = (Data *)0x0;
    local_190.bind.d.size = 0;
    local_190.bind.d.ptr = (char *)0x0;
    local_190.bind.d.d = (Data *)0x0;
    local_190.write.d.size = 0;
    local_190.write.d.ptr = (char *)0x0;
    local_190.write.d.d = (Data *)0x0;
    local_190.read.d.size = 0;
    local_190.read.d.ptr = (char *)0x0;
    local_190.read.d.d = (Data *)0x0;
    local_190.member.d.size = 0;
    local_190.member.d.ptr = (char *)0x0;
    local_190.member.d.d = (Data *)0x0;
    local_190.type.d.size = 0;
    local_190.type.d.ptr = (char *)0x0;
    local_190.type.d.d = (Data *)0x0;
    local_190.name.d.size = 0;
    local_190.name.d.ptr = (char *)0x0;
    local_190.name.d.d = (Data *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size;
    *pqVar2 = *pqVar2 + 1;
    PropertyDef::~PropertyDef(&local_190);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<PropertyDef>).
                      super_QArrayDataPointer<PropertyDef>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x7d05f417d05f417d)) {
      PropertyDef::PropertyDef
                ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                 ptr + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((PropertyDef *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.ptr))
      goto LAB_0012b83c;
      PropertyDef::PropertyDef
                ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                 ptr + -1,args);
      ppPVar1 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                 ptr;
      *ppPVar1 = *ppPVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }